

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_base.h
# Opt level: O0

bool CharToNetPacket(uchar *chardata,NetPacket *package)

{
  bool bVar1;
  uint32_t local_24;
  NetPacket *pNStack_20;
  uint32_t tmp32;
  NetPacket *package_local;
  uchar *chardata_local;
  
  pNStack_20 = package;
  package_local = (NetPacket *)chardata;
  bVar1 = CharToInt32(chardata,&local_24);
  if (bVar1) {
    pNStack_20->version = local_24;
    pNStack_20->header = package_local->header;
    pNStack_20->tail = package_local->tail;
    *(undefined8 *)pNStack_20->check = *(undefined8 *)package_local->check;
    *(undefined8 *)(pNStack_20->check + 8) = *(undefined8 *)(package_local->check + 8);
    bVar1 = CharToInt32((uchar *)&package_local->type,&local_24);
    if (bVar1) {
      pNStack_20->type = local_24;
      bVar1 = CharToInt32((uchar *)&package_local->datalen,&local_24);
      if (bVar1) {
        pNStack_20->datalen = local_24;
        bVar1 = CharToInt32((uchar *)&package_local->reserve,&local_24);
        if (bVar1) {
          pNStack_20->reserve = local_24;
          chardata_local._7_1_ = true;
        }
        else {
          chardata_local._7_1_ = false;
        }
      }
      else {
        chardata_local._7_1_ = false;
      }
    }
    else {
      chardata_local._7_1_ = false;
    }
  }
  else {
    chardata_local._7_1_ = false;
  }
  return chardata_local._7_1_;
}

Assistant:

inline bool CharToNetPacket(const unsigned char* chardata, NetPacket& package)
{
	uint32_t tmp32;
	if(!CharToInt32(chardata,tmp32)){
		return false;
	}
	package.version = tmp32;
	package.header = chardata[4];
	package.tail = chardata[5];
	memcpy(package.check,chardata+6,sizeof(package.check));
	if(!CharToInt32(chardata+22,tmp32)){
		return false;
	}
	package.type = tmp32;
	if(!CharToInt32(chardata+26,tmp32)){
		return false;
	}
	package.datalen = tmp32;
	if(!CharToInt32(chardata+30,tmp32)){
		return false;
	}
	package.reserve = tmp32;
	return true;
}